

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageHeader_TokenLengthIsZero_Test::
~CoapTest_CoapMessageHeader_TokenLengthIsZero_Test
          (CoapTest_CoapMessageHeader_TokenLengthIsZero_Test *this)

{
  CoapTest_CoapMessageHeader_TokenLengthIsZero_Test *this_local;
  
  ~CoapTest_CoapMessageHeader_TokenLengthIsZero_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_TokenLengthIsZero)
{
    ByteArray buffer{'`', 0, 0, 1};
    Error     error;
    auto      message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetToken(), ByteArray{});
}